

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lu_dfs.c
# Opt level: O1

lu_int lu_dfs(lu_int i,lu_int *begin,lu_int *end,lu_int *index,lu_int top,lu_int *xi,lu_int *pstack,
             lu_int *marked,lu_int M)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  int *piVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  bool bVar9;
  
  if (marked[i] != M) {
    *xi = i;
    if (end == (lu_int *)0x0) {
      uVar3 = 0;
      do {
        iVar1 = xi[uVar3];
        if (marked[iVar1] != M) {
          marked[iVar1] = M;
          pstack[uVar3] = begin[iVar1];
        }
        iVar2 = pstack[uVar3];
        iVar7 = index[iVar2];
        bVar9 = -1 < (long)iVar7;
        uVar4 = uVar3;
        if (bVar9) {
          if (marked[iVar7] == M) {
            piVar5 = index + (long)iVar2 + 1;
            do {
              iVar7 = *piVar5;
              lVar8 = (long)iVar7;
              bVar9 = lVar8 >= 0;
              if (lVar8 < 0) goto LAB_003bba4c;
              iVar2 = iVar2 + 1;
              piVar5 = piVar5 + 1;
            } while (marked[lVar8] == M);
          }
          else {
            bVar9 = true;
          }
          pstack[uVar3] = iVar2 + 1;
          uVar4 = uVar3 + 1;
          xi[(ulong)uVar3 + 1] = iVar7;
        }
LAB_003bba4c:
        uVar3 = uVar4;
        if (!bVar9) {
          uVar3 = uVar4 - 1;
          lVar8 = (long)top;
          top = top + -1;
          xi[lVar8 + -1] = iVar1;
        }
      } while (-1 < (int)uVar3);
    }
    else {
      uVar3 = 0;
      do {
        iVar1 = xi[uVar3];
        if (marked[iVar1] != M) {
          marked[iVar1] = M;
          pstack[uVar3] = begin[iVar1];
        }
        iVar2 = pstack[uVar3];
        iVar7 = end[iVar1];
        bVar9 = iVar2 < iVar7;
        if (iVar2 < iVar7) {
          lVar8 = (long)iVar2;
          iVar6 = index[lVar8];
          if (marked[iVar6] == M) {
            do {
              lVar8 = lVar8 + 1;
              if (iVar7 + -1 == iVar2) {
                bVar9 = lVar8 < iVar7;
                goto LAB_003bb9bf;
              }
              iVar6 = index[lVar8];
              iVar2 = iVar2 + 1;
            } while (marked[iVar6] == M);
            bVar9 = lVar8 < iVar7;
          }
          else {
            bVar9 = true;
          }
          pstack[uVar3] = iVar2 + 1;
          xi[(ulong)uVar3 + 1] = iVar6;
          uVar3 = uVar3 + 1;
        }
LAB_003bb9bf:
        if (!bVar9) {
          uVar3 = uVar3 - 1;
          lVar8 = (long)top;
          top = top + -1;
          xi[lVar8 + -1] = iVar1;
        }
      } while (-1 < (int)uVar3);
    }
  }
  return top;
}

Assistant:

lu_int lu_dfs(
    lu_int i, const lu_int *begin, const lu_int *end, const lu_int *index,
    lu_int top, lu_int *xi, lu_int *pstack, lu_int *marked, const lu_int M)
{
    if (marked[i] == M)
        return top;

    return end ?
        dfs_end(i, begin, end, index, top, xi, pstack, marked, M) :
        dfs(i, begin, index, top, xi, pstack, marked, M);
}